

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O2

bool loadDigitsDataset(Mat *trainData,Mat *responces,int *numRows,int *numCols,int *numImages)

{
  DIR *__dirp;
  dirent *pdVar1;
  float *pfVar2;
  int k;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  _InputArray local_3a8;
  int local_390;
  float local_38c;
  int local_388;
  float local_384;
  _InputArray local_380;
  int local_368;
  undefined4 local_364;
  char pathToImages [10];
  undefined8 local_338;
  undefined8 local_330;
  string digit;
  char text [257];
  Mat mat;
  Mat local_198 [96];
  char path [255];
  
  iVar4 = (int)numImages;
  *numImages = 0x307;
  local_330 = 0x30700000100;
  cv::Mat::Mat((Mat *)text,&local_330,5);
  cv::Mat::operator=(trainData,(Mat *)text);
  cv::Mat::~Mat((Mat *)text);
  local_338 = 0x30700000001;
  cv::Mat::Mat((Mat *)text,&local_338,5);
  cv::Mat::operator=(responces,(Mat *)text);
  cv::Mat::~Mat((Mat *)text);
  iVar6 = 0;
  for (iVar3 = 0; iVar3 != 10; iVar3 = iVar3 + 1) {
    builtin_strncpy(pathToImages,"./digits3",10);
    sprintf(path,"%s/%d",pathToImages);
    __dirp = opendir(path);
    if (__dirp != (DIR *)0x0) {
      local_38c = (float)iVar3;
      iVar5 = iVar6 << 8;
      local_390 = iVar3;
      while (pdVar1 = readdir(__dirp), iVar3 = local_390, pdVar1 != (dirent *)0x0) {
        if ((pdVar1->d_name[0] != '.') ||
           ((pdVar1->d_name[1] != '\0' &&
            ((pdVar1->d_name[1] != '.' || (pdVar1->d_name[2] != '\0')))))) {
          local_388 = iVar6;
          sprintf(text,"/%s",pdVar1->d_name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&digit,text,(allocator<char> *)&mat);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat,
                         path,&digit);
          std::__cxx11::string::operator=((string *)&digit,(string *)&mat);
          std::__cxx11::string::~string((string *)&mat);
          cv::imread((string *)&mat,(int)&digit);
          local_3a8.sz.width = 0;
          local_3a8.sz.height = 0;
          local_380.sz.width = 0;
          local_380.sz.height = 0;
          local_3a8.flags = 0x1010000;
          local_380.flags = 0x2010000;
          local_3a8.obj = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat;
          local_380.obj = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat;
          cv::cvtColor((cv *)&local_3a8,&local_380,(_OutputArray *)0x7,0,iVar4);
          local_3a8.sz.width = 0;
          local_3a8.sz.height = 0;
          local_380.sz.width = 0;
          local_380.sz.height = 0;
          local_3a8.flags = 0x1010000;
          local_380.flags = 0x2010000;
          local_3a8.obj = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat;
          local_380.obj = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat;
          cv::threshold(&local_3a8,(_OutputArray *)&local_380,200.0,255.0,8);
          local_3a8.sz.width = 0;
          local_3a8.sz.height = 0;
          local_3a8.flags = 0x2010000;
          local_3a8.obj = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat;
          cv::Mat::convertTo((_OutputArray *)&mat,(int)&local_3a8,0.00392156862745098,0.0);
          local_364 = 0x10;
          *numRows = 0x10;
          *numCols = 0x10;
          local_3a8.sz.width = 0;
          local_3a8.sz.height = 0;
          local_3a8.flags = 0x1010000;
          local_380.sz.width = 0;
          local_380.sz.height = 0;
          local_380.flags = 0x2010000;
          local_368 = *numRows;
          local_3a8.obj = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat;
          local_380.obj = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat;
          cv::resize(0,0,&local_3a8,&local_380,&local_368,0);
          cv::Mat::reshape((int)local_198,
                           (int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&mat);
          iVar6 = local_388;
          cv::Mat::~Mat(local_198);
          for (iVar3 = 0; iVar3 != 0x100; iVar3 = iVar3 + 1) {
            pfVar2 = cv::Mat::at<float>(&mat,iVar3);
            local_384 = *pfVar2;
            pfVar2 = cv::Mat::at<float>(trainData,iVar3 + iVar5);
            *pfVar2 = local_384;
          }
          pfVar2 = cv::Mat::at<float>(responces,iVar6);
          *pfVar2 = local_38c;
          iVar6 = iVar6 + 1;
          cv::Mat::~Mat(&mat);
          std::__cxx11::string::~string((string *)&digit);
          iVar5 = iVar5 + 0x100;
        }
      }
    }
    closedir(__dirp);
  }
  return true;
}

Assistant:

bool loadDigitsDataset(Mat &trainData, Mat &responces, int &numRows, int &numCols, int &numImages){
    int num = 775;
    numImages = num;
    int size = 16 * 16;
    trainData = Mat(Size(size, num), CV_32FC1);
    responces = Mat(Size(1, num), CV_32FC1);
    int counter = 0;
    for(int i=0;i<=9;i++){
        // reading the images from the folder of tarining samples
        DIR *dir;
        struct dirent *ent;
        char pathToImages[]="./digits3"; // name of the folder containing images
        char path[255];
        sprintf(path, "%s/%d", pathToImages, i);
        if ((dir = opendir(path)) != NULL){
            while ((ent = readdir (dir)) != NULL){
                if (strcmp(ent->d_name, ".") != 0 && strcmp(ent->d_name, "..") != 0 ){
                    char text[257];
                    sprintf(text,"/%s",ent->d_name);
                    string digit(text);
                    digit=path+digit;
                    Mat mat=imread(digit,1); //loading the image
                    cvtColor(mat,mat, COLOR_RGB2GRAY);  //converting into grayscale
                    threshold(mat , mat , 200, 255 ,THRESH_OTSU); // preprocessing
                    mat.convertTo(mat,CV_32FC1,1.0/255.0); //necessary to convert images to CV_32FC1 for using K nearest neighbour algorithm
                    numRows = 16;
                    numCols = 16;
                    resize(mat, mat, Size(numRows, numCols ),0,0,INTER_NEAREST); // same size as our testing samples
                    //cout << "number " << i << endl;
                    //imshow("mat", mat);
                    //waitKey(0);
                    //cout << "M = " << endl << " " << mat << endl << endl;
                    mat.reshape(1,1);
                    for (int k=0; k<size;k++) {
                        trainData.at<float>(counter*size+k) = mat.at<float>(k); // storing the pixels of the image
                          
                        //trainData.at<float>(i ,counter*numCols+k) = mat.at<float>(k);
                    }

                    responces.at<float>(counter) = i; // stroing the responce corresponding to image
                    counter++;
                }
            }
        }
        closedir(dir);
    }
    return true;
}